

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void __thiscall nite::Batch::flush(Batch *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  pointer ppRVar4;
  ulong uVar5;
  
  iVar3 = this->objectId;
  if (-1 < iVar3) {
    if (currentBatch != (Batch *)0x0) {
      print("bad Batch::flush(): check your code, a batch is not closing properly");
      iVar3 = this->objectId;
    }
    (*__glewBindFramebuffer)
              (0x8ca9,batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3].framebufferId);
    fVar1 = (this->size).x;
    fVar2 = (this->size).y;
    glClearColor(0,0,0,0);
    glClear(0x4000);
    glDisable(0xb71);
    glEnable(0xde1);
    glEnable(0xbe2);
    (*__glewBlendFuncSeparate)(0x302,0x303,1,0x303);
    glViewport(0,0,(int)fVar1,(int)fVar2);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho(0,(double)fVar1,0,(double)fVar2,0x3ff0000000000000,0xbff0000000000000);
    glMatrixMode(0x1700);
    glLoadIdentity();
    ppRVar4 = (this->objects).
              super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppRVar4) {
      uVar5 = 0;
      do {
        (*ppRVar4[uVar5]->function)(ppRVar4[uVar5]);
        uVar5 = uVar5 + 1;
        ppRVar4 = (this->objects).
                  super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->objects).
                                     super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar4 >> 3
                              ));
    }
    (*__glewBindFramebuffer)(0x8ca9,0);
    clearBuffer(this);
    return;
  }
  return;
}

Assistant:

void nite::Batch::flush(){
	if(objectId <= -1) return;
	if(currentBatch != NULL){
		nite::print("bad Batch::flush(): check your code, a batch is not closing properly");
	}	
	glBindFramebuffer(GL_DRAW_FRAMEBUFFER, batches[objectId].framebufferId);
	setupTarget(size.x, size.y);
	for(int i = 0; i < objects.size(); ++i){
		objects[i]->function(objects[i]);
	}
	glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	clearBuffer();
}